

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O2

void __thiscall EnrichableI2cAnalyzer::EnrichableI2cAnalyzer(EnrichableI2cAnalyzer *this)

{
  EnrichableI2cAnalyzerSettings *this_00;
  EnrichableAnalyzerSubprocess *this_01;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__EnrichableI2cAnalyzer_00110c60;
  this_00 = (EnrichableI2cAnalyzerSettings *)operator_new(0x60);
  EnrichableI2cAnalyzerSettings::EnrichableI2cAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (EnrichableI2cAnalyzerResults *)0x0;
  this_01 = (EnrichableAnalyzerSubprocess *)operator_new(0x40);
  EnrichableAnalyzerSubprocess::EnrichableAnalyzerSubprocess(this_01);
  (this->mSubprocess)._M_ptr = this_01;
  EnrichableI2cSimulationDataGenerator::EnrichableI2cSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  (this->mArrowLocataions).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mArrowLocataions).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mArrowLocataions).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

EnrichableI2cAnalyzer::EnrichableI2cAnalyzer()
:	Analyzer2(),  
	mSettings( new EnrichableI2cAnalyzerSettings() ),
	mSimulationInitilized( false ),
	mSubprocess( new EnrichableAnalyzerSubprocess() )
{
	SetAnalyzerSettings( mSettings.get() );
}